

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# websocket_location_handler.c
# Opt level: O1

void response_written(cio_http_client *client,cio_error err)

{
  cio_http_location_handler *pcVar1;
  size_t in_RDX;
  uint in_register_00000034;
  
  if (err == CIO_SUCCESS) {
    pcVar1 = client->current_handler;
    pcVar1[4].on_host = (cio_http_data_cb_t)client;
    (*pcVar1[0xc].on_body)
              ((cio_http_client *)&pcVar1[3].on_body,(char *)((ulong)in_register_00000034 << 0x20),
               in_RDX);
    return;
  }
  response_written_cold_1();
  return;
}

Assistant:

static void response_written(struct cio_http_client *client, enum cio_error err)
{
	struct cio_websocket_location_handler *wslh = cio_container_of(client->current_handler, struct cio_websocket_location_handler, http_location);
	struct cio_websocket *websocket = &wslh->websocket;

	if (cio_unlikely(err != CIO_SUCCESS)) {
		struct cio_http_server *server = cio_http_client_get_server(client);
		if (server->on_error != NULL) {
			server->on_error(server, "error while writing http upgrade response");
		}

		return;
	}

	websocket->ws_private.http_client = client;
	websocket->on_connect(websocket);
}